

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O0

int mg_session_write_point_2d(mg_session *session,mg_point_2d *point)

{
  uint uVar1;
  int status_4;
  int status_3;
  int status_2;
  int status_1;
  int status;
  uint8_t in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint local_4;
  
  local_4 = mg_session_write_uint8
                      ((mg_session *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcf);
  if ((((local_4 == 0) &&
       (local_4 = mg_session_write_uint8
                            ((mg_session *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcf), local_4 == 0)) &&
      (uVar1 = mg_session_write_integer
                         ((mg_session *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
      local_4 = uVar1, uVar1 == 0)) &&
     ((local_4 = mg_session_write_float
                           ((mg_session *)(ulong)in_stack_ffffffffffffffd8,
                            (double)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
      local_4 == 0 &&
      (local_4 = mg_session_write_float
                           ((mg_session *)((ulong)uVar1 << 0x20),
                            (double)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
      local_4 == 0)))) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mg_session_write_point_2d(mg_session *session, const mg_point_2d *point) {
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, (uint8_t)(MG_MARKER_TINY_STRUCT3)));
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_SIGNATURE_POINT_2D));
  MG_RETURN_IF_FAILED(mg_session_write_integer(session, point->srid));
  MG_RETURN_IF_FAILED(mg_session_write_float(session, point->x));
  MG_RETURN_IF_FAILED(mg_session_write_float(session, point->y));
  return 0;
}